

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O1

int __thiscall irwincolor::Map::load(Map *this,string *file,string *name)

{
  string *psVar1;
  double dVar2;
  pointer pdVar3;
  iterator iVar4;
  char *pcVar5;
  double *pdVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  reference pvVar11;
  ulong uVar12;
  long *plVar13;
  const_iterator cVar14;
  char_t *pcVar15;
  unspecified_bool_type p_Var16;
  int *piVar17;
  undefined8 *puVar18;
  undefined8 uVar19;
  ulong uVar20;
  xml_node_struct *pxVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  xml_attribute xVar25;
  double dVar26;
  undefined1 auVar27 [12];
  vector<float,_std::allocator<float>_> xrgb;
  vector<double,_std::allocator<double>_> tmp;
  json inj;
  xml_node point;
  string ext;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idxc;
  allocator<char> local_319;
  xml_attribute local_318;
  xml_node_struct *local_310;
  undefined1 local_308 [16];
  xml_attribute local_2f8;
  xml_attribute local_2f0;
  undefined1 local_2e8 [40];
  undefined1 local_2c0 [32];
  string *local_2a0;
  string *local_298;
  xml_node local_290;
  vector<double,_std::allocator<double>_> *local_288;
  vector<double,_std::allocator<double>_> *local_280;
  vector<double,_std::allocator<double>_> *local_278;
  double *local_270;
  xpath_node local_268;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 local_238 [520];
  
  pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  psVar1 = &this->space;
  this->nanr = 0.0;
  this->nang = 0.0;
  this->nanb = 0.0;
  local_298 = name;
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)(this->space)._M_string_length,0x14be2d);
  this->paraView = true;
  std::__cxx11::string::find_last_of((char *)file,0x143809,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_258,(ulong)file);
  local_278 = &this->r;
  local_280 = &this->g;
  local_288 = &this->b;
  local_270 = &this->nanr;
  iVar9 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar9 == 0) {
    pugi::xml_document::xml_document((xml_document *)local_238);
    iVar9 = loadXml(file,(xml_document *)local_238);
    local_2a0 = (string *)CONCAT44(local_2a0._4_4_,(uint)(iVar9 != 0));
    if (iVar9 == 0) {
      local_2e8._0_8_ = local_2e8 + 0x10;
      local_2e8._8_8_ = (object_t *)0x0;
      local_2e8._16_8_ = local_2e8._16_8_ & 0xffffffffffffff00;
      pugi::xpath_node::xpath_node(&local_268);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                     "/ColorMaps/ColorMap[@name=\'",local_298);
      plVar13 = (long *)std::__cxx11::string::append(local_2c0);
      pxVar21 = (xml_node_struct *)(plVar13 + 2);
      if ((xml_node_struct *)*plVar13 == pxVar21) {
        local_308._0_8_ = pxVar21->header;
        local_308._8_8_ = plVar13[3];
        local_318._attr = (xml_attribute_struct *)local_308;
      }
      else {
        local_308._0_8_ = pxVar21->header;
        local_318._attr = (xml_attribute_struct *)*plVar13;
      }
      local_310 = (xml_node_struct *)plVar13[1];
      *plVar13 = (long)pxVar21;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_318);
      if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
        operator_delete(local_318._attr,local_308._0_8_ + 1);
      }
      if ((xml_node_struct *)local_2c0._0_8_ != (xml_node_struct *)(local_2c0 + 0x10)) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      local_268 = pugi::xml_node::select_node
                            ((xml_node *)local_238,(char_t *)local_2e8._0_8_,
                             (xpath_variable_set *)0x0);
      bVar8 = pugi::xpath_node::operator!(&local_268);
      if (bVar8) {
LAB_0010932c:
        puVar18 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar18 = &PTR__exception_0015da50;
        __cxa_throw(puVar18,&XPathException::typeinfo,std::exception::~exception);
      }
      local_290 = pugi::xpath_node::node(&local_268);
      local_2c0._0_8_ = pugi::xml_node::parent(&local_290);
      local_318 = pugi::xml_node::attribute((xml_node *)local_2c0,"space");
      pcVar15 = pugi::xml_attribute::value(&local_318);
      pcVar5 = (char *)(this->space)._M_string_length;
      strlen(pcVar15);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,(ulong)pcVar15);
      local_290 = pugi::xpath_node::node(&local_268);
      while (p_Var16 = pugi::xml_node::operator_cast_to_function_pointer(&local_290),
            p_Var16 != (unspecified_bool_type)0x0) {
        local_2f8 = pugi::xml_node::attribute(&local_290,"x");
        pcVar15 = pugi::xml_attribute::value(&local_2f8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pcVar15,&local_319);
        xVar25._attr = local_318._attr;
        piVar17 = __errno_location();
        iVar9 = *piVar17;
        *piVar17 = 0;
        pxVar21 = (xml_node_struct *)strtod((char *)xVar25._attr,(char **)local_2c0);
        if ((xml_attribute_struct *)local_2c0._0_8_ == xVar25._attr) {
          std::__throw_invalid_argument("stod");
LAB_001092d8:
          std::__throw_invalid_argument("stod");
LAB_001092e4:
          std::__throw_invalid_argument("stod");
LAB_001092f0:
          std::__throw_invalid_argument("stod");
LAB_001092fc:
          std::__throw_out_of_range("stod");
LAB_00109308:
          std::__throw_out_of_range("stod");
LAB_00109314:
          std::__throw_out_of_range("stod");
LAB_00109320:
          std::__throw_out_of_range("stod");
          goto LAB_0010932c;
        }
        if (*piVar17 != 0) {
          if (*piVar17 != 0x22) goto LAB_00108a4d;
          goto LAB_00109308;
        }
        *piVar17 = iVar9;
LAB_00108a4d:
        iVar4._M_current =
             (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2f0._attr = (xml_attribute_struct *)pxVar21;
        if (iVar4._M_current ==
            (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->x,iVar4,(double *)&local_2f0);
        }
        else {
          *iVar4._M_current = (double)pxVar21;
          (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
          operator_delete(local_318._attr,local_308._0_8_ + 1);
        }
        local_2f8 = pugi::xml_node::attribute(&local_290,"r");
        pcVar15 = pugi::xml_attribute::value(&local_2f8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pcVar15,&local_319);
        xVar25._attr = local_318._attr;
        iVar9 = *piVar17;
        *piVar17 = 0;
        pxVar21 = (xml_node_struct *)strtod((char *)local_318._attr,(char **)local_2c0);
        if ((xml_attribute_struct *)local_2c0._0_8_ == xVar25._attr) goto LAB_001092d8;
        if (*piVar17 != 0) {
          if (*piVar17 != 0x22) goto LAB_00108b01;
          goto LAB_00109320;
        }
        *piVar17 = iVar9;
LAB_00108b01:
        iVar4._M_current =
             (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2f0._attr = (xml_attribute_struct *)pxVar21;
        if (iVar4._M_current ==
            (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_278,iVar4,(double *)&local_2f0);
        }
        else {
          *iVar4._M_current = (double)pxVar21;
          (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
          operator_delete(local_318._attr,local_308._0_8_ + 1);
        }
        local_2f8 = pugi::xml_node::attribute(&local_290,"g");
        pcVar15 = pugi::xml_attribute::value(&local_2f8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pcVar15,&local_319);
        xVar25._attr = local_318._attr;
        iVar9 = *piVar17;
        *piVar17 = 0;
        pxVar21 = (xml_node_struct *)strtod((char *)local_318._attr,(char **)local_2c0);
        if ((xml_attribute_struct *)local_2c0._0_8_ == xVar25._attr) goto LAB_001092e4;
        if (*piVar17 != 0) {
          if (*piVar17 != 0x22) goto LAB_00108bba;
          goto LAB_00109314;
        }
        *piVar17 = iVar9;
LAB_00108bba:
        iVar4._M_current =
             (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2f0._attr = (xml_attribute_struct *)pxVar21;
        if (iVar4._M_current ==
            (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_280,iVar4,(double *)&local_2f0);
        }
        else {
          *iVar4._M_current = (double)pxVar21;
          (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
          operator_delete(local_318._attr,local_308._0_8_ + 1);
        }
        local_2f8 = pugi::xml_node::attribute(&local_290,"b");
        pcVar15 = pugi::xml_attribute::value(&local_2f8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pcVar15,&local_319);
        xVar25._attr = local_318._attr;
        iVar9 = *piVar17;
        *piVar17 = 0;
        pxVar21 = (xml_node_struct *)strtod((char *)local_318._attr,(char **)local_2c0);
        if ((xml_attribute_struct *)local_2c0._0_8_ == xVar25._attr) goto LAB_001092f0;
        if (*piVar17 == 0) {
          *piVar17 = iVar9;
        }
        else if (*piVar17 == 0x22) goto LAB_001092fc;
        iVar4._M_current =
             (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2f0._attr = (xml_attribute_struct *)pxVar21;
        if (iVar4._M_current ==
            (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_288,iVar4,(double *)&local_2f0);
        }
        else {
          *iVar4._M_current = (double)pxVar21;
          (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
          operator_delete(local_318._attr,local_308._0_8_ + 1);
        }
        local_290 = pugi::xml_node::next_sibling(&local_290,"Point");
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                     "/ColorMaps/ColorMap[@name=\'",local_298);
      plVar13 = (long *)std::__cxx11::string::append(local_2c0);
      pxVar21 = (xml_node_struct *)(plVar13 + 2);
      if ((xml_node_struct *)*plVar13 == pxVar21) {
        local_308._0_8_ = pxVar21->header;
        local_308._8_8_ = plVar13[3];
        local_318._attr = (xml_attribute_struct *)local_308;
      }
      else {
        local_308._0_8_ = pxVar21->header;
        local_318._attr = (xml_attribute_struct *)*plVar13;
      }
      local_310 = (xml_node_struct *)plVar13[1];
      *plVar13 = (long)pxVar21;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_318);
      if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
        operator_delete(local_318._attr,local_308._0_8_ + 1);
      }
      if ((xml_node_struct *)local_2c0._0_8_ != (xml_node_struct *)(local_2c0 + 0x10)) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      local_268 = pugi::xml_node::select_node
                            ((xml_node *)local_238,(char_t *)local_2e8._0_8_,
                             (xpath_variable_set *)0x0);
      bVar8 = pugi::xpath_node::operator!(&local_268);
      if (bVar8) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar18 = &PTR__exception_0015da50;
        __cxa_throw(puVar18,&XPathException::typeinfo,std::exception::~exception);
      }
      local_290 = pugi::xpath_node::node(&local_268);
      local_2f0 = pugi::xml_node::attribute(&local_290,"r");
      pcVar15 = pugi::xml_attribute::value(&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,pcVar15,(allocator<char> *)&local_2f8);
      xVar25._attr = local_318._attr;
      piVar17 = __errno_location();
      iVar9 = *piVar17;
      *piVar17 = 0;
      dVar26 = strtod((char *)xVar25._attr,(char **)local_2c0);
      if ((xml_attribute_struct *)local_2c0._0_8_ == xVar25._attr) {
        std::__throw_invalid_argument("stod");
LAB_0010938e:
        std::__throw_invalid_argument("stod");
      }
      else {
        if (*piVar17 == 0) {
LAB_00108e46:
          *piVar17 = iVar9;
        }
        else if (*piVar17 == 0x22) {
          dVar26 = (double)std::__throw_out_of_range("stod");
          goto LAB_00108e46;
        }
        *local_270 = dVar26;
        if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
          operator_delete(local_318._attr,local_308._0_8_ + 1);
        }
        local_2f0 = pugi::xml_node::attribute(&local_290,"g");
        pcVar15 = pugi::xml_attribute::value(&local_2f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,pcVar15,(allocator<char> *)&local_2f8);
        xVar25._attr = local_318._attr;
        iVar9 = *piVar17;
        *piVar17 = 0;
        dVar26 = strtod((char *)local_318._attr,(char **)local_2c0);
        if ((xml_attribute_struct *)local_2c0._0_8_ == xVar25._attr) goto LAB_0010938e;
        if (*piVar17 == 0) {
LAB_00108ee5:
          *piVar17 = iVar9;
        }
        else if (*piVar17 == 0x22) {
          dVar26 = (double)std::__throw_out_of_range("stod");
          goto LAB_00108ee5;
        }
        this->nang = dVar26;
        if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
          operator_delete(local_318._attr,local_308._0_8_ + 1);
        }
        local_2f0 = pugi::xml_node::attribute(&local_290,"b");
        pcVar15 = pugi::xml_attribute::value(&local_2f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,pcVar15,(allocator<char> *)&local_2f8);
        xVar25._attr = local_318._attr;
        iVar9 = *piVar17;
        *piVar17 = 0;
        dVar26 = strtod((char *)local_318._attr,(char **)local_2c0);
        if ((xml_attribute_struct *)local_2c0._0_8_ != xVar25._attr) {
          if (*piVar17 == 0) {
LAB_00108f80:
            *piVar17 = iVar9;
          }
          else if (*piVar17 == 0x22) {
            dVar26 = (double)std::__throw_out_of_range("stod");
            goto LAB_00108f80;
          }
          this->nanb = dVar26;
          if ((xml_node_struct *)local_318._attr != (xml_node_struct *)local_308) {
            operator_delete(local_318._attr,local_308._0_8_ + 1);
          }
          bVar8 = true;
          if ((xml_node_struct *)local_2e8._0_8_ != (xml_node_struct *)(local_2e8 + 0x10)) {
            operator_delete((void *)local_2e8._0_8_,(ulong)((long)(uintptr_t *)local_2e8._16_8_ + 1)
                           );
          }
          goto LAB_00108fc6;
        }
      }
      cVar7 = (char)xVar25._attr;
      auVar27 = std::__throw_invalid_argument("stod");
      iVar9 = auVar27._8_4_;
      uVar19 = auVar27._0_8_;
      if (iVar9 == 2) {
        __cxa_begin_catch(uVar19);
        __cxa_end_catch();
      }
      else {
        if (iVar9 != 1) {
          if ((xml_node_struct *)local_318._attr != (xml_node_struct *)0x0) {
            operator_delete(local_318._attr,local_308._0_8_ - (long)local_318._attr);
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2c0);
          std::ifstream::~ifstream(local_238);
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          if ((iVar9 != 2) && (iVar9 != 1)) {
            _Unwind_Resume(uVar19);
          }
          __cxa_begin_catch(uVar19);
          __cxa_end_catch();
          return 0;
        }
        __cxa_begin_catch(uVar19);
        __cxa_end_catch();
      }
LAB_0010886b:
      if ((xml_node_struct *)local_318._attr != (xml_node_struct *)0x0) {
        operator_delete(local_318._attr,local_308._0_8_ - (long)local_318._attr);
      }
      goto LAB_00108882;
    }
    bVar8 = false;
LAB_00108fc6:
    pugi::xml_document::~xml_document((xml_document *)local_238);
    if (!bVar8) goto LAB_001095d3;
LAB_00108fdc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"NaN RGB = ",10);
    std::ostream::_M_insert<double>(*local_270);
    std::ostream::_M_insert<double>(this->nang);
    poVar10 = std::ostream::_M_insert<double>(this->nanb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Colormap space = ",0x11);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(this->space)._M_dataplus._M_p,
                         (this->space)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of interpolation points = ",0x21);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    sortidx<double>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238,&this->x);
    local_2e8._0_8_ = (xml_node_struct *)0x0;
    local_2e8._8_8_ = (object_t *)0x0;
    local_2e8._16_8_ = (xml_node_struct *)0x0;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2e8,&this->x);
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar22 != 0) {
      lVar22 = lVar22 >> 3;
      lVar23 = 0;
      do {
        pdVar3[lVar23] =
             (double)((uintptr_t *)local_2e8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar23 * 4)];
        lVar23 = lVar23 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2e8,local_278);
    pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar22 != 0) {
      lVar22 = lVar22 >> 3;
      lVar23 = 0;
      do {
        pdVar3[lVar23] =
             (double)((uintptr_t *)local_2e8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar23 * 4)];
        lVar23 = lVar23 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2e8,local_280);
    pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar22 != 0) {
      lVar22 = lVar22 >> 3;
      lVar23 = 0;
      do {
        pdVar3[lVar23] =
             (double)((uintptr_t *)local_2e8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar23 * 4)];
        lVar23 = lVar23 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2e8,local_288);
    pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar22 != 0) {
      lVar22 = lVar22 >> 3;
      lVar23 = 0;
      do {
        pdVar3[lVar23] =
             (double)((uintptr_t *)local_2e8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar23 * 4)];
        lVar23 = lVar23 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    }
    pdVar6 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar22 = (long)pdVar3 - (long)pdVar6;
    if (lVar22 != 0) {
      dVar26 = *pdVar6;
      lVar22 = lVar22 >> 3;
      dVar2 = pdVar3[-1];
      lVar23 = 0;
      do {
        pdVar6[lVar23] = (pdVar6[lVar23] - dVar26) / (dVar2 - dVar26);
        lVar23 = lVar23 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar23);
    }
    if ((xml_node_struct *)local_2e8._0_8_ != (xml_node_struct *)0x0) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
    }
    if ((xml_node_struct *)local_238._0_8_ != (xml_node_struct *)0x0) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
    }
    bVar8 = true;
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&local_258);
    if (iVar9 == 0) {
      std::ifstream::ifstream(local_238,(string *)file,_S_in);
      local_2c0._0_8_ = local_2c0._0_8_ & 0xffffffffffffff00;
      local_2c0._8_8_ = (object_t *)0x0;
      local_2a0 = (string *)psVar1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_2c0,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_2c0,true);
      nlohmann::operator>>
                ((istream *)local_238,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_2c0);
      std::ifstream::close();
      uVar24 = 1;
      do {
        uVar12 = (ulong)(uVar24 - 1);
        pvVar11 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_2c0,uVar12);
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"Name");
        local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
        local_2e8._8_8_ = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_2e8,local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_2e8,true);
        cVar7 = nlohmann::operator==
                          (pvVar11,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)local_2e8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_2e8);
        if ((bool)cVar7) {
          pvVar11 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_2c0,uVar12);
          pvVar11 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar11,"RGBPoints");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(&local_318,pvVar11);
          if (local_310 != (xml_node_struct *)local_318._attr) {
            uVar24 = 4;
            uVar20 = 0;
            do {
              local_2e8._0_8_ =
                   (undefined8)*(float *)((long)&(local_318._attr)->header + uVar20 * 4);
              iVar4._M_current =
                   (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&this->x,iVar4,(double *)local_2e8);
              }
              else {
                *iVar4._M_current = (double)local_2e8._0_8_;
                (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_2e8._0_8_ =
                   (undefined8)
                   *(float *)((long)&(local_318._attr)->header + (ulong)(uVar24 - 3) * 4);
              iVar4._M_current =
                   (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_278,iVar4,(double *)local_2e8);
              }
              else {
                *iVar4._M_current = (double)local_2e8._0_8_;
                (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_2e8._0_8_ =
                   (undefined8)
                   *(float *)((long)&(local_318._attr)->header + (ulong)(uVar24 - 2) * 4);
              iVar4._M_current =
                   (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_280,iVar4,(double *)local_2e8);
              }
              else {
                *iVar4._M_current = (double)local_2e8._0_8_;
                (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_2e8._0_8_ =
                   (undefined8)
                   *(float *)((long)&(local_318._attr)->header + (ulong)(uVar24 - 1) * 4);
              iVar4._M_current =
                   (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_288,iVar4,(double *)local_2e8);
              }
              else {
                *iVar4._M_current = (double)local_2e8._0_8_;
                (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              uVar20 = (ulong)uVar24;
              uVar24 = uVar24 + 4;
            } while (uVar20 < (ulong)((long)local_310 - (long)local_318._attr >> 2));
          }
          pvVar11 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_2c0,uVar12);
          pvVar11 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar11,"ColorSpace");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_2e8,pvVar11);
          std::__cxx11::string::operator=(local_2a0,(string *)local_2e8);
          if ((xml_node_struct *)local_2e8._0_8_ != (xml_node_struct *)(local_2e8 + 0x10)) {
            operator_delete((void *)local_2e8._0_8_,(ulong)((long)(uintptr_t *)local_2e8._16_8_ + 1)
                           );
          }
          pvVar11 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_2c0,uVar12);
          if ((pvVar11->m_type == object) &&
             (cVar14 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       ::_M_find_tr<char[9],void>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                   *)(pvVar11->m_value).object,(char (*) [9])"NanColor"),
             (_Rb_tree_header *)cVar14._M_node !=
             &(((pvVar11->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar11 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)local_2c0,uVar12);
            pvVar11 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  *)pvVar11,"NanColor");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(local_2e8,pvVar11);
            this->nanr = (double)*(float *)(uintptr_t *)local_2e8._0_8_;
            this->nang = (double)*(float *)((long)(uintptr_t *)local_2e8._0_8_ + 4);
            this->nanb = (double)*(float *)(local_2e8._0_8_ + 8);
            operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
          }
          goto LAB_0010886b;
        }
        uVar12 = local_2c0._0_8_ & 0xff;
        if (local_2c0[0] != null) {
          if (local_2c0[0] == object) {
            uVar12 = (((_Rep_type *)local_2c0._8_8_)->_M_impl).super__Rb_tree_header._M_node_count;
          }
          else if (local_2c0[0] == array) {
            uVar12 = (long)(((_Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)local_2c0._8_8_)->_M_impl).super__Vector_impl_data._M_finish -
                     (long)(((_Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)local_2c0._8_8_)->_M_impl).super__Vector_impl_data._M_start >> 4;
          }
          else {
            uVar12 = 1;
          }
        }
        uVar20 = (ulong)uVar24;
        uVar24 = uVar24 + 1;
      } while (uVar20 < uVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nError:  cannot find colormap name \"",0x24);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(local_298->_M_dataplus)._M_p,
                           local_298->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
LAB_00108882:
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_2c0);
      std::ifstream::~ifstream(local_238);
      local_2a0 = (string *)CONCAT44(local_2a0._4_4_,0xfffffffe);
      if (cVar7 != '\0') goto LAB_00108fdc;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nError:  unknown colormap file extension \".",0x2b);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_258,local_250);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      local_2a0 = (string *)CONCAT44(local_2a0._4_4_,0xfffffffa);
    }
LAB_001095d3:
    bVar8 = false;
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (bVar8) {
    return 0;
  }
  return (int)local_2a0;
}

Assistant:

int load(std::string file, std::string name)
	{ try {
		x.clear();
		r.clear();
		g.clear();
		b.clear();
		nanr = 0;
		nang = 0;
		nanb = 0;
		space = "RGB";
		paraView = true;

		std::string ext = file.substr(file.find_last_of(".") + 1);
		if (ext == "xml")
		{
			pugi::xml_document doc;
			if (int io = loadXml(file, doc) != 0)
				return io;

			std::string xquery;
			pugi::xpath_node point0;
			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/Point";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				//std::cout << "point0 = " << point0.node().first_attribute().value() << "\n";
				space = point0.node().parent().attribute("space").value();
				for (pugi::xml_node point = point0.node(); point; point = point.next_sibling("Point"))
				{
					//std::cout << "b = " << point.attribute("b").value() << std::endl;
					x.push_back(std::stod(point.attribute("x").value()));
					r.push_back(std::stod(point.attribute("r").value()));
					g.push_back(std::stod(point.attribute("g").value()));
					b.push_back(std::stod(point.attribute("b").value()));
				}
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot parse colormap \"" << name << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_XML_PARSE;
			}

			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/NaN";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				pugi::xml_node nan = point0.node();
				nanr = std::stod(nan.attribute("r").value());
				nang = std::stod(nan.attribute("g").value());
				nanb = std::stod(nan.attribute("b").value());
			}
			catch (const std::exception& e)
			{
				// Do nothing.  Use default NaN color.
			}
		}
		else if (ext == "json")
		{
			std::ifstream ifs(file);
			json inj;

			try
			{
				ifs >> inj;
				ifs.close();  // close to release lock on file
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot load JSON colormap file \"" << file << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_JSON;
			}

			//std::cout << "Input JSON =\n" << std::setw(4) << inj << "\n" << std::endl;

			unsigned int i = 0;
			while (inj[i]["Name"] != name)
			{
				i++;
				if (i >= inj.size())
				{
					std::cout << "\nError:  cannot find colormap name \"" << name << "\"." << std::endl;
					return ERR_JSON;
				}
			}

			//std::string name0 = inj[i]["Name"];
			//std::cout << "name0 = " << name0 << std::endl;

			std::vector<float> xrgb = inj[i]["RGBPoints"];
			//std::cout << "xrgb = " << xrgb << std::endl;
			for (unsigned int j = 0; j < xrgb.size();)
			{
				x.push_back(xrgb[j++]);
				r.push_back(xrgb[j++]);
				g.push_back(xrgb[j++]);
				b.push_back(xrgb[j++]);
			}

			space = inj[i]["ColorSpace"];

			if (inj[i].contains("NanColor"))
			{
				//std::cout << "contains NanColor\n\n";

				try
				{
					std::vector<float> nan = inj[i]["NanColor"];
					nanr = nan[0];
					nang = nan[1];
					nanb = nan[2];
				}
				catch (const nlohmann::detail::type_error& e)
				{
				}
				catch (const std::exception& e)
				{
					// Do nothing.  Use default NaN color.
				}
			}
			//else
			//{
			//	std::cout << "does not contain NanColor\n\n";
			//}

		}
		else
		{
			std::cout << "\nError:  unknown colormap file extension \"." << ext << "\"." << std::endl;
			return ERR_FILETYPE;
		}

		std::cout << "NaN RGB = " << nanr << nang << nanb << "\n";
		std::cout << "Colormap space = " << space << "\n";
		std::cout << "Number of interpolation points = " << x.size() << "\n";
		std::cout << std::endl;

		// Sort by x.
		auto idxc = sortidx(x);
		std::vector<double> tmp;
		tmp = x;
		for (int i = 0; i < x.size(); i++)
			x[i] = tmp[idxc[i]];
		tmp = r;
		for (int i = 0; i < r.size(); i++)
			r[i] = tmp[idxc[i]];
		tmp = g;
		for (int i = 0; i < g.size(); i++)
			g[i] = tmp[idxc[i]];
		tmp = b;
		for (int i = 0; i < b.size(); i++)
			b[i] = tmp[idxc[i]];

		// Map x to range [0, 1], since some XMLs use [-1, 1] instead.
		auto cxmin = x[0];
		auto cxmax = x[x.size() - 1];
		for (int i = 0; i < x.size(); i++)
			x[i] = (x[i] - cxmin) / (cxmax - cxmin);

		//std::cout << "Color map:\n";
		//for (int i = 0; i < x.size(); i++)
		//{
		//	std::cout << "x = " << x[i] << ", r = " << r[i]
		//	        << ", g = " << g[i] << ", b = " << b[i] << "\n";
		//}

		}
		catch (const nlohmann::detail::type_error& e)
		{
		}
		catch (const std::exception& e)
		{
			// Do nothing.  Use default NaN color.
		}

		return 0;
	}